

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall
Assimp::IFC::TempMesh::ComputePolygonNormals
          (TempMesh *this,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *normals,
          bool normalize,size_t ofs)

{
  long lVar1;
  uint num;
  IfcVector3 *pIVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  unsigned_long *puVar6;
  size_type sVar7;
  size_type sVar8;
  reference puVar9;
  reference pvVar10;
  reference out;
  reference y;
  reference z;
  reference this_00;
  double dVar11;
  IfcVector3 *n;
  iterator __end3;
  iterator __begin3;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range3;
  aiVector3t<double> local_e8;
  const_reference local_d0;
  IfcVector3 *v;
  size_t cnt;
  size_t vofs;
  uint *local_a0;
  uint *local_98;
  long local_90;
  size_t vidx;
  allocator<double> local_71;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> temp;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator iit;
  const_iterator end;
  const_iterator begin;
  size_t max_vcount;
  size_t ofs_local;
  bool normalize_local;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *normals_local;
  TempMesh *this_local;
  
  begin._M_current = (uint *)0x0;
  end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->mVertcnt);
  __last = __gnu_cxx::
           __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator+(&end,ofs);
  iit = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->mVertcnt);
  __gnu_cxx::
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::__normal_iterator(&local_50);
  local_50 = __last;
  while (bVar4 = __gnu_cxx::operator!=(&local_50,&iit), bVar4) {
    puVar9 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_50);
    temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(ulong)*puVar9;
    puVar6 = std::max<unsigned_long>
                       ((unsigned_long *)&begin,
                        (unsigned_long *)
                        &temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    begin._M_current = (uint *)*puVar6;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_50);
  }
  lVar1 = (long)begin._M_current * 4;
  std::allocator<double>::allocator(&local_71);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,lVar1 + 8,&local_71);
  std::allocator<double>::~allocator(&local_71);
  sVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(normals);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (normals,(sVar7 + sVar8) - ofs);
  local_98 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&this->mVertcnt);
  local_a0 = __last._M_current;
  iVar5 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )local_98,__last,0);
  local_90 = (long)iVar5;
  local_50 = __last;
  while (bVar4 = __gnu_cxx::operator!=(&local_50,&iit), bVar4) {
    puVar9 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_50);
    if (*puVar9 == 0) {
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vofs);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                (normals,(aiVector3t<double> *)&vofs);
    }
    else {
      v = (IfcVector3 *)0x0;
      for (cnt = 0; sVar3 = cnt,
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_50), sVar3 < *puVar9; cnt = cnt + 1) {
        local_d0 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             (&this->mVerts,local_90 + cnt);
        pIVar2 = v;
        dVar11 = local_d0->x;
        v = (IfcVector3 *)((long)&v->x + 1);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_70,(size_type)pIVar2);
        pIVar2 = v;
        *pvVar10 = dVar11;
        dVar11 = local_d0->y;
        v = (IfcVector3 *)((long)&v->x + 1);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_70,(size_type)pIVar2);
        pIVar2 = v;
        *pvVar10 = dVar11;
        dVar11 = local_d0->z;
        v = (IfcVector3 *)((long)&v->x + 1);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_70,(size_type)pIVar2);
        *pvVar10 = dVar11;
        dVar11 = std::numeric_limits<double>::quiet_NaN();
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_70,(size_type)v);
        *pvVar10 = dVar11;
        v = (IfcVector3 *)((long)&v->x + 1);
      }
      aiVector3t<double>::aiVector3t(&local_e8);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                (normals,&local_e8);
      out = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::back(normals);
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_50);
      num = *puVar9;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_70,0);
      y = std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_70,1);
      z = std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_70,2);
      NewellNormal<4,4,4,double>(out,num,pvVar10,y,z);
    }
    __range3 = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
               __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator++(&local_50,0);
    puVar9 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&__range3);
    local_90 = (ulong)*puVar9 + local_90;
  }
  if (normalize) {
    __end3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin(normals);
    n = (IfcVector3 *)
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(normals);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                       *)&n), bVar4) {
      this_00 = __gnu_cxx::
                __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                ::operator*(&__end3);
      aiVector3t<double>::Normalize(this_00);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_70);
  return;
}

Assistant:

void TempMesh::ComputePolygonNormals(std::vector<IfcVector3>& normals,
    bool normalize,
    size_t ofs) const
{
    size_t max_vcount = 0;
    std::vector<unsigned int>::const_iterator begin = mVertcnt.begin()+ofs, end = mVertcnt.end(),  iit;
    for(iit = begin; iit != end; ++iit) {
        max_vcount = std::max(max_vcount,static_cast<size_t>(*iit));
    }

    std::vector<IfcFloat> temp((max_vcount+2)*4);
    normals.reserve( normals.size() + mVertcnt.size()-ofs );

    // `NewellNormal()` currently has a relatively strange interface and need to
    // re-structure things a bit to meet them.
    size_t vidx = std::accumulate(mVertcnt.begin(),begin,0);
    for(iit = begin; iit != end; vidx += *iit++) {
        if (!*iit) {
            normals.push_back(IfcVector3());
            continue;
        }
        for(size_t vofs = 0, cnt = 0; vofs < *iit; ++vofs) {
            const IfcVector3& v = mVerts[vidx+vofs];
            temp[cnt++] = v.x;
            temp[cnt++] = v.y;
            temp[cnt++] = v.z;
#ifdef ASSIMP_BUILD_DEBUG
            temp[cnt] = std::numeric_limits<IfcFloat>::quiet_NaN();
#endif
            ++cnt;
        }

        normals.push_back(IfcVector3());
        NewellNormal<4,4,4>(normals.back(),*iit,&temp[0],&temp[1],&temp[2]);
    }

    if(normalize) {
        for(IfcVector3& n : normals) {
            n.Normalize();
        }
    }
}